

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

void __thiscall
RPCArg::RPCArg(RPCArg *this,string name,Type type,Fallback fallback,string description,
              vector<RPCArg,_std::allocator<RPCArg>_> inner,RPCArgOptions opts)

{
  pointer pRVar1;
  _Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_RCX;
  Type in_EDX;
  undefined4 in_register_00000034;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  undefined8 *in_R9;
  long in_FS_OFFSET;
  bool local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((string *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000034,type));
  this->m_type = in_EDX;
  pRVar1 = (pointer)in_R9[1];
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*in_R9;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar1;
  (this->m_inner).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_R9[2];
  *in_R9 = 0;
  in_R9[1] = 0;
  in_R9[2] = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::_Move_ctor_base((_Move_ctor_base<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                     *)&this->m_fallback,in_RCX);
  std::__cxx11::string::string((string *)&this->m_description,in_R8);
  RPCArgOptions::RPCArgOptions(&this->m_opts,(RPCArgOptions *)name._M_dataplus._M_p);
  if (in_EDX < OBJ_USER_KEYS) {
    local_39 = true;
    if ((0x23U >> (in_EDX & 0x1f) & 1) != 0) goto LAB_00297291;
  }
  local_39 = in_EDX == OBJ_USER_KEYS;
LAB_00297291:
  inline_check_non_fatal<bool>
            (&local_39,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.h"
             ,0xf7,"RPCArg",
             "type == Type::ARR || type == Type::OBJ || type == Type::OBJ_NAMED_PARAMS || type == Type::OBJ_USER_KEYS"
            );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCArg(
        std::string name,
        Type type,
        Fallback fallback,
        std::string description,
        std::vector<RPCArg> inner,
        RPCArgOptions opts = {})
        : m_names{std::move(name)},
          m_type{std::move(type)},
          m_inner{std::move(inner)},
          m_fallback{std::move(fallback)},
          m_description{std::move(description)},
          m_opts{std::move(opts)}
    {
        CHECK_NONFATAL(type == Type::ARR || type == Type::OBJ || type == Type::OBJ_NAMED_PARAMS || type == Type::OBJ_USER_KEYS);
    }